

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O3

TV __thiscall Nova::Grid<float,_2>::Node(Grid<float,_2> *this,T_INDEX *index)

{
  undefined8 uVar1;
  Vector<float,_2,_true> *data_copy;
  undefined8 *in_RDI;
  T_STORAGE TVar2;
  
  uVar1 = *(undefined8 *)(index->_data)._M_elems;
  TVar2._M_elems[0] = (float)((int)uVar1 + -1);
  TVar2._M_elems[1] = (float)((int)((ulong)uVar1 >> 0x20) + -1);
  *in_RDI = CONCAT44((float)((ulong)*(undefined8 *)(this + 0x18) >> 0x20) * TVar2._M_elems[1] +
                     (float)((ulong)*(undefined8 *)(this + 8) >> 0x20),
                     (float)*(undefined8 *)(this + 0x18) * TVar2._M_elems[0] +
                     (float)*(undefined8 *)(this + 8));
  return (T_STORAGE)(T_STORAGE)TVar2._M_elems;
}

Assistant:

TV Node(const T_INDEX& index) const
    {
        return domain.min_corner+TV(index-1)*dX;
    }